

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateTransformFeedbackResourceListBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool reducedSet)

{
  Node *pNVar1;
  StorageQualifier *this;
  TransformFeedbackTarget *pTVar2;
  TestNode *pTVar3;
  Variable *pVVar4;
  ArrayElement *pAVar5;
  undefined1 local_118 [8];
  SharedPtr variable_3;
  SharedPtr xfbTarget_4;
  SharedPtr arrayElem_1;
  SharedPtr variable_2;
  SharedPtr arrayElem;
  SharedPtr xfbTarget_3;
  SharedPtr variable_1;
  SharedPtr xfbTarget_2;
  SharedPtr structMbr;
  SharedPtr variable;
  SharedPtr xfbTarget_1;
  SharedPtr xfbTarget;
  SharedPtr output;
  undefined1 local_38 [8];
  SharedPtr defaultBlock;
  bool reducedSet_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  defaultBlock.m_state._7_1_ = reducedSet;
  pNVar1 = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock((DefaultBlock *)pNVar1,parentStructure);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_38,pNVar1);
  this = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier(this,(SharedPtr *)local_38,STORAGE_OUT);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&xfbTarget.m_state,(Node *)this);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,(SharedPtr *)local_38,"gl_Position");
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&xfbTarget_1.m_state,(Node *)pTVar2);
  pTVar3 = (TestNode *)operator_new(0x98);
  FeedbackResourceListTestCase::FeedbackResourceListTestCase
            ((FeedbackResourceListTestCase *)pTVar3,context,(SharedPtr *)&xfbTarget_1.m_state,
             "builtin_gl_position");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&xfbTarget_1.m_state);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,(SharedPtr *)&xfbTarget.m_state,(char *)0x0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&variable.m_state,(Node *)pTVar2);
  pVVar4 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable.m_state,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&structMbr.m_state,(Node *)pVVar4);
  pTVar3 = (TestNode *)operator_new(0x98);
  FeedbackResourceListTestCase::FeedbackResourceListTestCase
            ((FeedbackResourceListTestCase *)pTVar3,context,(SharedPtr *)&structMbr.m_state,
             "default_block_basic_type");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&structMbr.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&variable.m_state);
  pNVar1 = (Node *)operator_new(0x20);
  ResourceDefinition::StructMember::StructMember
            ((StructMember *)pNVar1,(SharedPtr *)&xfbTarget.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&xfbTarget_2.m_state,pNVar1);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,(SharedPtr *)&xfbTarget_2.m_state,(char *)0x0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&variable_1.m_state,(Node *)pTVar2);
  pVVar4 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_1.m_state,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&xfbTarget_3.m_state,(Node *)pVVar4);
  pTVar3 = (TestNode *)operator_new(0x98);
  FeedbackResourceListTestCase::FeedbackResourceListTestCase
            ((FeedbackResourceListTestCase *)pTVar3,context,(SharedPtr *)&xfbTarget_3.m_state,
             "default_block_struct_member");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&xfbTarget_3.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&variable_1.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&xfbTarget_2.m_state);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,(SharedPtr *)&xfbTarget.m_state,(char *)0x0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&arrayElem.m_state,(Node *)pTVar2);
  pAVar5 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar5,(SharedPtr *)&arrayElem.m_state,-1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&variable_2.m_state,(Node *)pAVar5);
  pVVar4 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_2.m_state,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&arrayElem_1.m_state,(Node *)pVVar4);
  pTVar3 = (TestNode *)operator_new(0x98);
  FeedbackResourceListTestCase::FeedbackResourceListTestCase
            ((FeedbackResourceListTestCase *)pTVar3,context,(SharedPtr *)&arrayElem_1.m_state,
             "default_block_array");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&arrayElem_1.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&variable_2.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&arrayElem.m_state);
  pAVar5 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar5,(SharedPtr *)&xfbTarget.m_state,-1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&xfbTarget_4.m_state,(Node *)pAVar5);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,(SharedPtr *)&xfbTarget_4.m_state,(char *)0x0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&variable_3.m_state,(Node *)pTVar2);
  pVVar4 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_3.m_state,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_118,(Node *)pVVar4);
  pTVar3 = (TestNode *)operator_new(0x98);
  FeedbackResourceListTestCase::FeedbackResourceListTestCase
            ((FeedbackResourceListTestCase *)pTVar3,context,(SharedPtr *)local_118,
             "default_block_array_element");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_118);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&variable_3.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&xfbTarget_4.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&xfbTarget.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_38);
  return;
}

Assistant:

static void generateTransformFeedbackResourceListBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool reducedSet)
{
	const ResourceDefinition::Node::SharedPtr	defaultBlock	(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr	output			(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_OUT));

	DE_UNREF(reducedSet);

	// .builtin_gl_position
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget(new ResourceDefinition::TransformFeedbackTarget(defaultBlock, "gl_Position"));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, xfbTarget, "builtin_gl_position"));
	}
	// .default_block_basic_type
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(output));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, variable, "default_block_basic_type"));
	}
	// .default_block_struct_member
	{
		const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(output));
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(structMbr));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, variable, "default_block_struct_member"));
	}
	// .default_block_array
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(output));
		const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(xfbTarget));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, variable, "default_block_array"));
	}
	// .default_block_array_element
	{
		const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(arrayElem));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, variable, "default_block_array_element"));
	}
}